

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml)

{
  cmLocalGenerator *this_00;
  cmSourceFile *this_01;
  pointer this_02;
  undefined8 uVar1;
  bool bVar2;
  TargetType TVar3;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_03;
  reference ppcVar4;
  cmMakefile *this_04;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_05;
  reference ppcVar5;
  string *psVar6;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__x;
  reference ppcVar7;
  cmSourceGroup *this_06;
  char *local_1f0;
  cmSourceGroup *sourceGroup;
  string *source;
  cmSourceFile *sf;
  iterator __end4;
  iterator __begin4;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range4;
  string local_170;
  undefined1 local_150 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  cmGeneratorTarget *gt;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string local_110;
  char *local_f0;
  char *prefix;
  string linkName2;
  cmGeneratorTarget *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *targets;
  cmMakefile *makefile;
  cmLocalGenerator *lg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  string local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string linkName;
  cmXMLWriter *xml_local;
  cmExtraEclipseCDT4Generator *this_local;
  
  linkName.field_2._8_8_ = xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"[Targets]",&local_39);
  std::allocator<char>::~allocator(&local_39);
  uVar1 = linkName.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"virtual:/virtual",(allocator<char> *)((long)&__range1 + 7));
  AppendLinkedResource((cmXMLWriter *)uVar1,(string *)local_38,&local_70,VirtualFolder);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  this_03 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(this_03);
  lg = (cmLocalGenerator *)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(this_03);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&lg), bVar2) {
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppcVar4;
    this_04 = cmLocalGenerator::GetMakefile(this_00);
    this_05 = cmLocalGenerator::GetGeneratorTargets(this_00);
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_05);
    target = (cmGeneratorTarget *)
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_05);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                       *)&target), bVar2) {
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end2);
      linkName2.field_2._8_8_ = *ppcVar5;
      std::__cxx11::string::string((string *)&prefix,(string *)local_38);
      std::__cxx11::string::operator+=((string *)&prefix,"/");
      TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)linkName2.field_2._8_8_);
      if (TVar3 < UTILITY) {
        TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)linkName2.field_2._8_8_);
        if (TVar3 == EXECUTABLE) {
          local_1f0 = "[exe] ";
        }
        else {
          local_1f0 = "[lib] ";
        }
        local_f0 = local_1f0;
        std::__cxx11::string::operator+=((string *)&prefix,local_1f0);
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)linkName2.field_2._8_8_)
        ;
        std::__cxx11::string::operator+=((string *)&prefix,(string *)psVar6);
        uVar1 = linkName.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"virtual:/virtual",
                   (allocator<char> *)
                   ((long)&sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        AppendLinkedResource((cmXMLWriter *)uVar1,(string *)&prefix,&local_110,VirtualFolder);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        if ((this->GenerateLinkedResources & 1U) != 0) {
          __x = cmMakefile::GetSourceGroups(this_04);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt,__x);
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)linkName2.field_2._8_8_;
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_150);
          this_02 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,"CMAKE_BUILD_TYPE",
                     (allocator<char> *)((long)&__range4 + 7));
          psVar6 = cmMakefile::GetSafeDefinition(this_04,&local_170);
          cmGeneratorTarget::GetSourceFiles
                    ((cmGeneratorTarget *)this_02,
                     (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_150,psVar6);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
          __end4 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                             ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_150);
          sf = (cmSourceFile *)
               std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_150);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                             *)&sf), bVar2) {
            ppcVar7 = __gnu_cxx::
                      __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                      ::operator*(&__end4);
            this_01 = *ppcVar7;
            psVar6 = cmSourceFile::GetFullPath(this_01,(string *)0x0);
            this_06 = cmMakefile::FindSourceGroup
                                (this_04,psVar6,
                                 (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt);
            cmSourceGroup::AssignSource(this_06,this_01);
            __gnu_cxx::
            __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
            ::operator++(&__end4);
          }
          WriteGroups(this,(vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt,
                      (string *)&prefix,(cmXMLWriter *)linkName.field_2._8_8_);
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_150);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt);
        }
      }
      std::__cxx11::string::~string((string *)&prefix);
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(cmXMLWriter& xml)
{
  std::string linkName = "[Targets]";
  cmExtraEclipseCDT4Generator::AppendLinkedResource(
    xml, linkName, "virtual:/virtual", VirtualFolder);

  for (cmLocalGenerator* lg : this->GlobalGenerator->GetLocalGenerators()) {
    cmMakefile* makefile = lg->GetMakefile();
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();

    for (cmGeneratorTarget* target : targets) {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          const char* prefix =
            (target->GetType() == cmStateEnums::EXECUTABLE ? "[exe] "
                                                           : "[lib] ");
          linkName2 += prefix;
          linkName2 += target->GetName();
          cmExtraEclipseCDT4Generator::AppendLinkedResource(
            xml, linkName2, "virtual:/virtual", VirtualFolder);
          if (!this->GenerateLinkedResources) {
            break; // skip generating the linked resources to the source files
          }
          std::vector<cmSourceGroup> sourceGroups =
            makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmGeneratorTarget* gt = const_cast<cmGeneratorTarget*>(target);
          std::vector<cmSourceFile*> files;
          gt->GetSourceFiles(files,
                             makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* sf : files) {
            // Add the file to the list of sources.
            std::string const& source = sf->GetFullPath();
            cmSourceGroup* sourceGroup =
              makefile->FindSourceGroup(source, sourceGroups);
            sourceGroup->AssignSource(sf);
          }

          this->WriteGroups(sourceGroups, linkName2, xml);
        } break;
        // ignore all others:
        default:
          break;
      }
    }
  }
}